

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# implot_items.cpp
# Opt level: O1

bool __thiscall
ImPlot::RectRenderer<ImPlot::GetterHeatmap<unsigned_char>,_ImPlot::TransformerLinLog>::operator()
          (RectRenderer<ImPlot::GetterHeatmap<unsigned_char>,_ImPlot::TransformerLinLog> *this,
          ImDrawList *DrawList,ImRect *cull_rect,ImVec2 *uv,int prim)

{
  float *pfVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  double dVar5;
  double dVar6;
  double dVar7;
  double dVar8;
  int iVar9;
  uint uVar10;
  GetterHeatmap<unsigned_char> *pGVar11;
  TransformerLinLog *pTVar12;
  ImPlotPlot *pIVar13;
  ImDrawVert *pIVar14;
  ImDrawIdx *pIVar15;
  ImVec2 IVar16;
  double dVar17;
  ImPlotContext *pIVar18;
  ImPlotContext *pIVar19;
  bool bVar20;
  bool bVar21;
  ImDrawIdx IVar22;
  ImU32 IVar23;
  float fVar24;
  float fVar25;
  double dVar26;
  double dVar27;
  float fVar28;
  float fVar29;
  float fVar30;
  double dVar31;
  ImVec2 IVar32;
  
  pGVar11 = this->Getter;
  dVar2 = (pGVar11->HalfSize).x;
  dVar27 = (pGVar11->HalfSize).y;
  dVar31 = (double)(prim % pGVar11->Cols) * pGVar11->Width + pGVar11->XRef + dVar2;
  dVar17 = ((double)(prim / pGVar11->Cols) * pGVar11->Height + dVar27) * pGVar11->YDir +
           pGVar11->YRef;
  fVar24 = (float)(((double)pGVar11->Values[prim] - pGVar11->ScaleMin) /
                  (pGVar11->ScaleMax - pGVar11->ScaleMin));
  fVar28 = 1.0;
  if (fVar24 <= 1.0) {
    fVar28 = fVar24;
  }
  IVar23 = ImPlotColormapData::LerpTable
                     (&GImPlot->ColormapData,(GImPlot->Style).Colormap,
                      (float)(~-(uint)(fVar24 < 0.0) & (uint)fVar28));
  pIVar18 = GImPlot;
  pTVar12 = this->Transformer;
  dVar26 = log10((dVar17 - dVar27) / GImPlot->CurrentPlot->YAxis[pTVar12->YAxis].Range.Min);
  pIVar19 = GImPlot;
  iVar9 = pTVar12->YAxis;
  dVar3 = pIVar18->LogDenY[iVar9];
  pIVar13 = pIVar18->CurrentPlot;
  dVar4 = pIVar13->YAxis[iVar9].Range.Min;
  dVar5 = pIVar13->YAxis[iVar9].Range.Max;
  dVar6 = pIVar18->My[iVar9];
  fVar28 = pIVar18->PixelRange[iVar9].Min.x;
  dVar7 = (pIVar13->XAxis).Range.Min;
  dVar8 = pIVar18->Mx;
  fVar24 = pIVar18->PixelRange[iVar9].Min.y;
  pTVar12 = this->Transformer;
  dVar27 = log10((dVar17 + dVar27) / GImPlot->CurrentPlot->YAxis[pTVar12->YAxis].Range.Min);
  if (IVar23 < 0x1000000) {
    bVar21 = false;
  }
  else {
    fVar29 = (float)((((double)(float)(dVar26 / dVar3) * (dVar5 - dVar4) + dVar4) - dVar4) * dVar6 +
                    (double)fVar24);
    iVar9 = pTVar12->YAxis;
    pIVar13 = pIVar19->CurrentPlot;
    dVar17 = pIVar13->YAxis[iVar9].Range.Min;
    fVar25 = (float)((((double)(float)(dVar27 / pIVar19->LogDenY[iVar9]) *
                       (pIVar13->YAxis[iVar9].Range.Max - dVar17) + dVar17) - dVar17) *
                     pIVar19->My[iVar9] + (double)pIVar19->PixelRange[iVar9].Min.y);
    fVar24 = fVar29;
    if (fVar25 <= fVar29) {
      fVar24 = fVar25;
    }
    bVar20 = false;
    bVar21 = false;
    if ((fVar24 < (cull_rect->Max).y) &&
       (fVar24 = (float)(~-(uint)(fVar25 <= fVar29) & (uint)fVar25 |
                        -(uint)(fVar25 <= fVar29) & (uint)fVar29), pfVar1 = &(cull_rect->Min).y,
       bVar21 = bVar20, *pfVar1 <= fVar24 && fVar24 != *pfVar1)) {
      fVar30 = (float)(((dVar31 - dVar2) - dVar7) * dVar8 + (double)fVar28);
      fVar24 = (float)(((dVar2 + dVar31) - (pIVar13->XAxis).Range.Min) * pIVar19->Mx +
                      (double)pIVar19->PixelRange[iVar9].Min.x);
      fVar28 = fVar30;
      if (fVar24 <= fVar30) {
        fVar28 = fVar24;
      }
      if ((fVar28 < (cull_rect->Max).x) &&
         (fVar28 = (float)(~-(uint)(fVar24 <= fVar30) & (uint)fVar24 |
                          -(uint)(fVar24 <= fVar30) & (uint)fVar30),
         (cull_rect->Min).x <= fVar28 && fVar28 != (cull_rect->Min).x)) {
        IVar32.y = fVar29;
        IVar32.x = fVar30;
        DrawList->_VtxWritePtr->pos = IVar32;
        DrawList->_VtxWritePtr->uv = *uv;
        pIVar14 = DrawList->_VtxWritePtr;
        pIVar14->col = IVar23;
        pIVar14[1].pos.x = fVar30;
        pIVar14[1].pos.y = fVar25;
        pIVar14[1].uv = *uv;
        pIVar14 = DrawList->_VtxWritePtr;
        pIVar14[1].col = IVar23;
        IVar16.y = fVar25;
        IVar16.x = fVar24;
        pIVar14[2].pos = IVar16;
        DrawList->_VtxWritePtr[2].uv = *uv;
        pIVar14 = DrawList->_VtxWritePtr;
        pIVar14[2].col = IVar23;
        pIVar14[3].pos.x = fVar24;
        pIVar14[3].pos.y = fVar29;
        pIVar14[3].uv = *uv;
        pIVar14 = DrawList->_VtxWritePtr;
        pIVar14[3].col = IVar23;
        DrawList->_VtxWritePtr = pIVar14 + 4;
        uVar10 = DrawList->_VtxCurrentIdx;
        pIVar15 = DrawList->_IdxWritePtr;
        IVar22 = (ImDrawIdx)uVar10;
        *pIVar15 = IVar22;
        pIVar15[1] = IVar22 + 1;
        pIVar15[2] = IVar22 + 3;
        pIVar15[3] = IVar22 + 1;
        pIVar15[4] = IVar22 + 2;
        pIVar15[5] = IVar22 + 3;
        DrawList->_IdxWritePtr = pIVar15 + 6;
        DrawList->_VtxCurrentIdx = uVar10 + 4;
        bVar21 = true;
      }
    }
  }
  return bVar21;
}

Assistant:

inline bool operator()(ImDrawList& DrawList, const ImRect& cull_rect, const ImVec2& uv, int prim) const {
        RectInfo rect = Getter(prim);
        ImVec2 P1 = Transformer(rect.Min);
        ImVec2 P2 = Transformer(rect.Max);

        if ((rect.Color & IM_COL32_A_MASK) == 0 || !cull_rect.Overlaps(ImRect(ImMin(P1, P2), ImMax(P1, P2))))
            return false;

        DrawList._VtxWritePtr[0].pos   = P1;
        DrawList._VtxWritePtr[0].uv    = uv;
        DrawList._VtxWritePtr[0].col   = rect.Color;
        DrawList._VtxWritePtr[1].pos.x = P1.x;
        DrawList._VtxWritePtr[1].pos.y = P2.y;
        DrawList._VtxWritePtr[1].uv    = uv;
        DrawList._VtxWritePtr[1].col   = rect.Color;
        DrawList._VtxWritePtr[2].pos   = P2;
        DrawList._VtxWritePtr[2].uv    = uv;
        DrawList._VtxWritePtr[2].col   = rect.Color;
        DrawList._VtxWritePtr[3].pos.x = P2.x;
        DrawList._VtxWritePtr[3].pos.y = P1.y;
        DrawList._VtxWritePtr[3].uv    = uv;
        DrawList._VtxWritePtr[3].col   = rect.Color;
        DrawList._VtxWritePtr += 4;
        DrawList._IdxWritePtr[0] = (ImDrawIdx)(DrawList._VtxCurrentIdx);
        DrawList._IdxWritePtr[1] = (ImDrawIdx)(DrawList._VtxCurrentIdx + 1);
        DrawList._IdxWritePtr[2] = (ImDrawIdx)(DrawList._VtxCurrentIdx + 3);
        DrawList._IdxWritePtr[3] = (ImDrawIdx)(DrawList._VtxCurrentIdx + 1);
        DrawList._IdxWritePtr[4] = (ImDrawIdx)(DrawList._VtxCurrentIdx + 2);
        DrawList._IdxWritePtr[5] = (ImDrawIdx)(DrawList._VtxCurrentIdx + 3);
        DrawList._IdxWritePtr   += 6;
        DrawList._VtxCurrentIdx += 4;
        return true;
    }